

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void despot::DESPOT::ExploitBlockers(VNode *vnode)

{
  bool bVar1;
  VNode *pVVar2;
  QNode *pQVar3;
  pointer ppVar4;
  double dVar5;
  ValuedAction VVar6;
  double value_1;
  VNode *node;
  _Self local_48;
  const_iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *siblings;
  double value;
  VNode *blocker;
  VNode *cur;
  VNode *vnode_local;
  
  blocker = vnode;
  if (0.0 < DAT_00278a80) {
    while ((blocker != (VNode *)0x0 && (pVVar2 = FindBlocker(blocker), pVVar2 != (VNode *)0x0))) {
      pQVar3 = VNode::parent(blocker);
      if ((pQVar3 == (QNode *)0x0) || (pVVar2 == blocker)) {
        VVar6 = VNode::default_move(blocker);
        dVar5 = VVar6.value;
        VNode::lower_bound(blocker,dVar5);
        VNode::upper_bound(blocker,dVar5);
        blocker->utility_upper_bound = dVar5;
      }
      else {
        pQVar3 = VNode::parent(blocker);
        it._M_node = (_Base_ptr)QNode::children(pQVar3);
        local_48._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
             ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                      *)it._M_node);
        while( true ) {
          node = (VNode *)std::
                          map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                          ::end((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                                 *)it._M_node);
          bVar1 = std::operator!=(&local_48,(_Self *)&node);
          if (!bVar1) break;
          ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::
                   operator->(&local_48);
          pVVar2 = ppVar4->second;
          VVar6 = VNode::default_move(pVVar2);
          dVar5 = VVar6.value;
          VNode::lower_bound(pVVar2,dVar5);
          VNode::upper_bound(pVVar2,dVar5);
          pVVar2->utility_upper_bound = dVar5;
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
                    (&local_48,0);
        }
      }
      Backup(blocker);
      pQVar3 = VNode::parent(blocker);
      if (pQVar3 == (QNode *)0x0) {
        blocker = (VNode *)0x0;
      }
      else {
        pQVar3 = VNode::parent(blocker);
        blocker = QNode::parent(pQVar3);
      }
    }
  }
  return;
}

Assistant:

void DESPOT::ExploitBlockers(VNode* vnode) {
	if (Globals::config.pruning_constant <= 0) {
		return;
	}

	VNode* cur = vnode;
	while (cur != NULL) {
		VNode* blocker = FindBlocker(cur);

		if (blocker != NULL) {
			if (cur->parent() == NULL || blocker == cur) {
				double value = cur->default_move().value;
				cur->lower_bound(value);
				cur->upper_bound(value);
				cur->utility_upper_bound = value;
			} else {
				const map<OBS_TYPE, VNode*>& siblings =
					cur->parent()->children();
				for (map<OBS_TYPE, VNode*>::const_iterator it = siblings.begin();
					it != siblings.end(); it++) {
					VNode* node = it->second;
					double value = node->default_move().value;
					node->lower_bound(value);
					node->upper_bound(value);
					node->utility_upper_bound = value;
				}
			}

			Backup(cur);

			if (cur->parent() == NULL) {
				cur = NULL;
			} else {
				cur = cur->parent()->parent();
			}
		} else {
			break;
		}
	}
}